

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O3

int Abc_NtkCountAndNodes(Vec_Ptr_t *vOrder)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  if ((long)vOrder->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      uVar1 = *(uint *)((long)vOrder->pArray[lVar4] + 0x14);
      uVar5 = uVar1 & 0xf;
      if (uVar5 == 7) {
        iVar3 = iVar3 + 1;
      }
      else {
        if (uVar5 != 10 && (uVar1 & 0xe) != 8) {
          __assert_fail("Abc_ObjIsBox(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                        ,0x139,"int Abc_NtkCountAndNodes(Vec_Ptr_t *)");
        }
        lVar2 = *(long *)(*(long *)((long)vOrder->pArray[lVar4] + 0x38) + 0x158);
        iVar3 = iVar3 + *(int *)(lVar2 + 0x18) +
                ~(*(int *)(*(long *)(lVar2 + 0x48) + 4) + *(int *)(*(long *)(lVar2 + 0x40) + 4));
      }
      lVar4 = lVar4 + 1;
    } while (vOrder->nSize != lVar4);
  }
  return iVar3;
}

Assistant:

int Abc_NtkCountAndNodes( Vec_Ptr_t * vOrder )
{
    Gia_Man_t * pGiaBox;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
        {
            Counter++;
            continue;
        }
        assert( Abc_ObjIsBox(pObj) );
        pNtkModel = (Abc_Ntk_t *)pObj->pData;
        pGiaBox   = (Gia_Man_t *)pNtkModel->pData;
        Counter  += Gia_ManAndNum(pGiaBox);
    }
    return Counter;
}